

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::RemoveColumnInfo::Deserialize(RemoveColumnInfo *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  RemoveColumnInfo *this_00;
  pointer pRVar4;
  pointer *__ptr;
  unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true> result;
  _Head_base<0UL,_duckdb::RemoveColumnInfo_*,_false> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  int iVar3;
  
  this_00 = (RemoveColumnInfo *)operator_new(0xa0);
  RemoveColumnInfo(this_00);
  local_58._M_head_impl = this_00;
  pRVar4 = unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
           ::operator->((unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,400,"removed_column");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pRVar4->removed_column,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005d3791;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pRVar4->removed_column,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005d3791;
  }
  operator_delete(local_50);
LAB_005d3791:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pRVar4 = unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
           ::operator->((unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x191,"if_column_exists");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  pRVar4->if_column_exists = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pRVar4 = unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
           ::operator->((unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x192,"cascade");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  pRVar4->cascade = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> RemoveColumnInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RemoveColumnInfo>(new RemoveColumnInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "removed_column", result->removed_column);
	deserializer.ReadPropertyWithDefault<bool>(401, "if_column_exists", result->if_column_exists);
	deserializer.ReadPropertyWithDefault<bool>(402, "cascade", result->cascade);
	return std::move(result);
}